

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void __thiscall
testing::internal::
UniversalPrinter<std::variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>>
::Visitor::operator()(Visitor *this,MouseLeftButtonDown *u)

{
  ostream *poVar1;
  string local_38 [32];
  MouseLeftButtonDown *local_18;
  MouseLeftButtonDown *u_local;
  Visitor *this_local;
  
  local_18 = u;
  u_local = (MouseLeftButtonDown *)this;
  poVar1 = std::operator<<(*(ostream **)this,"\'");
  GetTypeName<solitaire::events::MouseLeftButtonDown>();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"(index = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(this + 8));
  std::operator<<(poVar1,")\' with value ");
  std::__cxx11::string::~string(local_38);
  UniversalPrint<solitaire::events::MouseLeftButtonDown>(local_18,*(ostream **)this);
  return;
}

Assistant:

void operator()(const U& u) const {
      *os << "'" << GetTypeName<U>() << "(index = " << index
          << ")' with value ";
      UniversalPrint(u, os);
    }